

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O1

int FmsIOWriteFmsMetaData(FmsIOContext *ctx,FmsIOFunctions *io,char *key,FmsMetaData mdata)

{
  int iVar1;
  char *pcVar2;
  char *key_00;
  void *pvVar3;
  bool bVar4;
  void *data;
  FmsInt size;
  FmsIntType int_type;
  FmsMetaDataType type;
  char *mdata_name;
  void *local_68;
  char *local_60;
  FmsMetaData *local_58;
  FmsMetaDataType local_4c;
  char *local_48 [3];
  
  iVar1 = FmsMetaDataGetType(mdata,&local_4c);
  if (1 < iVar1) {
    return 1;
  }
  if (iVar1 == 1) {
    return 0;
  }
  pcVar2 = join_keys(key,"MetaDataType");
  (*io->add_string)(ctx,pcVar2,FmsMetaDataTypeNames[local_4c]);
  if (pcVar2 != (char *)0x0) {
    free(pcVar2);
  }
  switch(local_4c) {
  case FMS_INTEGER:
    bVar4 = false;
    local_48[0] = (char *)0x0;
    local_68 = (void *)0x0;
    iVar1 = FmsMetaDataGetIntegers
                      (mdata,local_48,(FmsIntType *)&local_58,(FmsInt *)&local_60,&local_68);
    if (iVar1 != 0) {
      iVar1 = 3;
      goto LAB_00111a13;
    }
    pcVar2 = join_keys(key,"Name");
    iVar1 = (*io->add_string)(ctx,pcVar2,local_48[0]);
    if (pcVar2 != (char *)0x0) {
      free(pcVar2);
    }
    if (iVar1 == 0) {
      pcVar2 = join_keys(key,"Data");
      iVar1 = (*io->add_typed_int_array)
                        (ctx,pcVar2,(FmsScalarType)local_58,local_68,(FmsInt)local_60);
      if (pcVar2 != (char *)0x0) {
        free(pcVar2);
      }
      bVar4 = iVar1 == 0;
      iVar1 = 5;
      goto LAB_00111a13;
    }
    iVar1 = 4;
    break;
  case FMS_SCALAR:
    bVar4 = false;
    local_48[0] = (char *)0x0;
    local_68 = (void *)0x0;
    iVar1 = FmsMetaDataGetScalars
                      (mdata,local_48,(FmsScalarType *)&local_58,(FmsInt *)&local_60,&local_68);
    if (iVar1 != 0) {
      iVar1 = 6;
      goto LAB_00111a13;
    }
    pcVar2 = join_keys(key,"Name");
    iVar1 = (*io->add_string)(ctx,pcVar2,local_48[0]);
    if (pcVar2 != (char *)0x0) {
      free(pcVar2);
    }
    if (iVar1 == 0) {
      pcVar2 = join_keys(key,"Data");
      iVar1 = (*io->add_scalar_array)(ctx,pcVar2,(FmsScalarType)local_58,local_68,(FmsInt)local_60);
      if (pcVar2 != (char *)0x0) {
        free(pcVar2);
      }
      bVar4 = iVar1 == 0;
      iVar1 = 8;
      goto LAB_00111a13;
    }
    iVar1 = 7;
    break;
  case FMS_STRING:
    bVar4 = false;
    local_48[0] = (char *)0x0;
    local_60 = (char *)0x0;
    iVar1 = FmsMetaDataGetString(mdata,local_48,&local_60);
    if (iVar1 != 0) {
      iVar1 = 9;
      goto LAB_00111a13;
    }
    pcVar2 = join_keys(key,"Name");
    iVar1 = (*io->add_string)(ctx,pcVar2,local_48[0]);
    if (pcVar2 != (char *)0x0) {
      free(pcVar2);
    }
    if (iVar1 == 0) {
      pcVar2 = join_keys(key,"Data");
      iVar1 = (*io->add_string)(ctx,pcVar2,local_60);
      if (pcVar2 != (char *)0x0) {
        free(pcVar2);
      }
      bVar4 = iVar1 == 0;
      iVar1 = 0xb;
      goto LAB_00111a13;
    }
    iVar1 = 10;
    break;
  case FMS_META_DATA:
    bVar4 = false;
    local_60 = (char *)0x0;
    local_68 = (void *)0x0;
    local_58 = (FmsMetaData *)0x0;
    iVar1 = FmsMetaDataGetMetaData(mdata,&local_60,(FmsInt *)&local_68,&local_58);
    if (iVar1 != 0) {
      iVar1 = 0xc;
      goto LAB_00111a13;
    }
    if (local_58 == (FmsMetaData *)0x0) {
      iVar1 = 0xd;
    }
    else {
      pcVar2 = join_keys(key,"Name");
      iVar1 = (*io->add_string)(ctx,pcVar2,local_60);
      if (pcVar2 != (char *)0x0) {
        free(pcVar2);
      }
      if (iVar1 == 0) {
        pcVar2 = join_keys(key,"Size");
        iVar1 = (*io->add_int)(ctx,pcVar2,(FmsInt)local_68);
        if (pcVar2 != (char *)0x0) {
          free(pcVar2);
        }
        if (iVar1 == 0) {
          pcVar2 = join_keys(key,"Data");
          if (local_68 != (void *)0x0) {
            pvVar3 = (void *)0x0;
            do {
              sprintf((char *)local_48,"%d",(ulong)pvVar3 & 0xffffffff);
              key_00 = join_keys(pcVar2,(char *)local_48);
              iVar1 = FmsIOWriteFmsMetaData(ctx,io,key_00,local_58[(long)pvVar3]);
              if (key_00 != (char *)0x0) {
                free(key_00);
              }
              if (iVar1 != 0) {
                if (pcVar2 != (char *)0x0) {
                  free(pcVar2);
                }
                iVar1 = 0x10;
                goto LAB_00111a10;
              }
              pvVar3 = (void *)((long)pvVar3 + 1);
            } while (pvVar3 < local_68);
          }
          iVar1 = 0x10;
          bVar4 = true;
          if (pcVar2 != (char *)0x0) {
            free(pcVar2);
          }
          goto LAB_00111a13;
        }
        iVar1 = 0xf;
      }
      else {
        iVar1 = 0xe;
      }
    }
    break;
  default:
    return 0x11;
  }
LAB_00111a10:
  bVar4 = false;
LAB_00111a13:
  if (bVar4) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
FmsIOWriteFmsMetaData(FmsIOContext *ctx, FmsIOFunctions *io, const char *key,
                      FmsMetaData mdata) {
  int err = 0;
  FmsMetaDataType type;

  /* It says it returns 1 if mdata is empty, but then just checks if its null (if im not mistaken).
      We already null checked before we got here so I'm not sure if we need to check for 1. */
  int r = FmsMetaDataGetType(mdata, &type);
  if(r > 1)
    E_RETURN(1);
  else if(r == 1)
    return 0;

  char *kmdtype = join_keys(key, "MetaDataType");
  (*io->add_string)(ctx, kmdtype, FmsMetaDataTypeNames[type]);
  FREE(kmdtype);

  switch(type) {
  case FMS_INTEGER: {
    char *kname = NULL, *kdata = NULL;
    const char *mdata_name = NULL;
    FmsIntType int_type;
    FmsInt size;
    const void *data = NULL;

    if(FmsMetaDataGetIntegers(mdata, &mdata_name, &int_type, &size, &data))
      E_RETURN(3);

    kname = join_keys(key, "Name");
    err = (*io->add_string)(ctx, kname, mdata_name);
    FREE(kname);
    if (err) { E_RETURN(4); }

    kdata = join_keys(key, "Data");
    err = (*io->add_typed_int_array)(ctx, kdata, int_type, data, size);
    FREE(kdata);
    if (err) { E_RETURN(5); }
    break;
  }
  case FMS_SCALAR: {
    char *kname = NULL, *kdata = NULL;
    const char *mdata_name = NULL;
    FmsScalarType scalar_type;
    FmsInt size;
    const void *data = NULL;

    if(FmsMetaDataGetScalars(mdata, &mdata_name, &scalar_type, &size, &data))
      E_RETURN(6);

    kname = join_keys(key, "Name");
    err = (*io->add_string)(ctx, kname, mdata_name);
    FREE(kname);
    if (err) { E_RETURN(7); }

    kdata = join_keys(key, "Data");
    err = (*io->add_scalar_array)(ctx, kdata, scalar_type, data, size);
    FREE(kdata);
    if (err) { E_RETURN(8); }
    break;
  }
  case FMS_STRING: {
    char *kname = NULL, *kdata = NULL;
    const char *mdata_name = NULL;
    const char *data = NULL;

    if(FmsMetaDataGetString(mdata, &mdata_name, &data))
      E_RETURN(9);

    kname = join_keys(key, "Name");
    err = (*io->add_string)(ctx, kname, mdata_name);
    FREE(kname);
    if (err) { E_RETURN(10); }

    kdata = join_keys(key, "Data");
    err = (*io->add_string)(ctx, kdata, data);
    FREE(kdata);
    if (err) { E_RETURN(11); }
    break;
  }
  case FMS_META_DATA: {
    char *kname = NULL, *kdata = NULL, *ksize = NULL;
    const char *mdata_name = NULL;
    FmsInt i, size = 0;
    FmsMetaData *data = NULL;

    if(FmsMetaDataGetMetaData(mdata, &mdata_name, &size, &data))
      E_RETURN(12);

    if (!data) { E_RETURN(13); }

    kname = join_keys(key, "Name");
    err = (*io->add_string)(ctx, kname, mdata_name);
    FREE(kname);
    if (err) { E_RETURN(14); }

    ksize = join_keys(key, "Size");
    err = (*io->add_int)(ctx, ksize, size);
    FREE(ksize);
    if (err) { E_RETURN(15); }

    kdata = join_keys(key, "Data");
    // Recursive?
    for(i = 0; i < size; i++) {
      char temp[20], *tk = NULL;
      sprintf(temp, "%d", (int)i);
      tk = join_keys(kdata, temp);
      err = FmsIOWriteFmsMetaData(ctx, io, tk, data[i]);
      FREE(tk);
      if (err) {
        FREE(kdata);
        E_RETURN(16);
      }
    }
    FREE(kdata);
    break;
  }
  default:
    E_RETURN(17);
    break;
  }
  return 0;
}